

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildRegPressureAnalysis(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::LivenessAnalysis,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::operator=(&this->reg_pressure_,&local_18);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,_std::default_delete<spvtools::opt::LivenessAnalysis>_>
  ::~unique_ptr(&local_18);
  AVar1 = operator|(this->valid_analyses_,kAnalysisRegisterPressure);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildRegPressureAnalysis() {
    reg_pressure_ = MakeUnique<LivenessAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisRegisterPressure;
  }